

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O0

vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
* __thiscall
absl::cord_internal::CordzHandle::DiagnosticsGetSafeToInspectDeletedHandles
          (vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
           *__return_storage_ptr__,CordzHandle *this)

{
  bool bVar1;
  CordzHandle *local_48;
  CordzHandle *p;
  MutexLock lock;
  Queue *global_queue;
  CordzHandle *this_local;
  vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  *handles;
  
  std::
  vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  ::vector(__return_storage_ptr__);
  bVar1 = is_snapshot(this);
  if (bVar1) {
    lock.mu_ = &anon_unknown_0::GlobalQueue()->mutex;
    MutexLock::MutexLock((MutexLock *)&p,lock.mu_);
    for (local_48 = this->dq_next_; local_48 != (CordzHandle *)0x0; local_48 = local_48->dq_next_) {
      bVar1 = is_snapshot(local_48);
      if (!bVar1) {
        std::
        vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
        ::push_back(__return_storage_ptr__,&local_48);
      }
    }
    MutexLock::~MutexLock((MutexLock *)&p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const CordzHandle*>
CordzHandle::DiagnosticsGetSafeToInspectDeletedHandles() {
  std::vector<const CordzHandle*> handles;
  if (!is_snapshot()) {
    return handles;
  }

  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  for (const CordzHandle* p = dq_next_; p != nullptr; p = p->dq_next_) {
    if (!p->is_snapshot()) {
      handles.push_back(p);
    }
  }
  return handles;
}